

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O1

void __thiscall
chaiscript::Boxed_Value::Boxed_Value<std::__cxx11::string&,void>
          (Boxed_Value *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
          bool t_return_value)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pcVar1 = (t->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,pcVar1,pcVar1 + t->_M_string_length)
  ;
  Object_Data::get<std::__cxx11::string>((Object_Data *)this,&local_40,t_return_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

explicit Boxed_Value(T &&t, bool t_return_value = false)
          : m_data(Object_Data::get(std::forward<T>(t), t_return_value))
        {
        }